

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O1

word zzMulW(word *b,word *a,size_t n,word w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  word wVar4;
  size_t sVar5;
  
  if (n == 0) {
    wVar4 = 0;
  }
  else {
    sVar5 = 0;
    wVar4 = 0;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = wVar4;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = w;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = a[sVar5];
      auVar3 = auVar1 * auVar2 + auVar3;
      wVar4 = auVar3._8_8_;
      b[sVar5] = auVar3._0_8_;
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
  }
  return wVar4;
}

Assistant:

word zzMulW(word b[], const word a[], size_t n, register word w)
{
	register word carry = 0;
	register dword prod;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
		zzMul11(prod, w, a[i]);
		prod += carry;
		b[i] = (word)prod;
		carry = (word)(prod >> B_PER_W);
	}
	prod = 0, w = 0;
	return carry;
}